

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_add_mhmarker(opj_codestream_info_t *cstr_info,unsigned_short type,int pos,int len)

{
  void *pvVar1;
  undefined4 in_ECX;
  int in_EDX;
  undefined2 in_SI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) < *(int *)(in_RDI + 0x48) + 1) {
    *(int *)(in_RDI + 0x58) = (int)((float)*(int *)(in_RDI + 0x58) * 1.0) + 100;
    pvVar1 = realloc(*(void **)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0x58));
    *(void **)(in_RDI + 0x50) = pvVar1;
  }
  *(undefined2 *)(*(long *)(in_RDI + 0x50) + (long)*(int *)(in_RDI + 0x48) * 0x18) = in_SI;
  *(long *)(*(long *)(in_RDI + 0x50) + (long)*(int *)(in_RDI + 0x48) * 0x18 + 8) = (long)in_EDX;
  *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)*(int *)(in_RDI + 0x48) * 0x18 + 0x10) = in_ECX;
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
  return;
}

Assistant:

static void j2k_add_mhmarker(opj_codestream_info_t *cstr_info, unsigned short int type, int pos, int len)
{
	assert(cstr_info != 00);

	/* expand the list? */
	if ((cstr_info->marknum + 1) > cstr_info->maxmarknum) {
		cstr_info->maxmarknum = 100 + (int) ((float) cstr_info->maxmarknum * 1.0F);
		cstr_info->marker = (opj_marker_info_t*)opj_realloc(cstr_info->marker, cstr_info->maxmarknum);
	}

	/* add the marker */
	cstr_info->marker[cstr_info->marknum].type = type;
	cstr_info->marker[cstr_info->marknum].pos = pos;
	cstr_info->marker[cstr_info->marknum].len = len;
	cstr_info->marknum++;

}